

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O1

void __thiscall script_tests::script_standard_push::test_method(script_standard_push *this)

{
  void *pvVar1;
  int iVar2;
  readonly_property65 rVar3;
  bool bVar4;
  int iVar5;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  span<const_std::byte,_18446744073709551615UL> b;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  ScriptError err;
  CScript script;
  char *in_stack_fffffffffffffdc0;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  BaseSignatureChecker local_200;
  assertion_result local_1f8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 local_18c [4];
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  assertion_result local_148;
  char *local_130;
  assertion_result local_128;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  assertion_result local_e0;
  BaseSignatureChecker *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  ScriptError local_9c;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [24];
  undefined8 uStack_60;
  undefined1 local_58 [28];
  uint uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_200._vptr_BaseSignatureChecker = local_200._vptr_BaseSignatureChecker & 0xffffffff00000000;
  iVar5 = 0;
  do {
    local_58._16_8_ = 0;
    stack0xffffffffffffffc0 = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    CScript::push_int64((CScript *)local_58,(long)iVar5);
    local_b0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_a8 = "";
    local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0x517;
    file.m_begin = (iterator)&local_b0;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_c0,msg);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CScript::IsPushOnly((CScript *)local_58);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_013aff98;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c8 = (BaseSignatureChecker *)0xed17b9;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_013affd8;
    local_88._0_8_ = &local_e0;
    local_88._8_8_ = &local_200;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_013b0018;
    uStack_60 = " is not pure push.";
    local_f0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_e8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    local_78._16_8_ = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_f0,0x517);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
    local_100 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_f8 = "";
    local_110 = &boost::unit_test::basic_cstring<char_const>::null;
    local_108 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x518;
    file_00.m_begin = (iterator)&local_100;
    msg_00.m_end = pvVar7;
    msg_00.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
               msg_00);
    local_78._16_8_ = 0;
    uStack_60 = (char *)0x0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    local_98[0] = 0x51;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(iterator)local_78,
               (uchar *)local_98);
    local_1f8._0_8_ = &PTR_CheckECDSASignature_013afeb0;
    local_128.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)
         VerifyScript((CScript *)local_58,(CScript *)local_78,(CScriptWitness *)0x0,0x40,
                      (BaseSignatureChecker *)&local_1f8,&local_9c);
    local_128.m_message.px = (element_type *)0x0;
    local_128.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
    local_148._0_8_ = &PTR__lazy_ostream_013aff98;
    local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_130 = "Number ";
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_013affd8;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)&local_148;
    local_c8 = &local_200;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_013b0058;
    local_88._0_8_ = &local_e0;
    local_88._8_8_ = " push is not minimal data.";
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_150 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_128,(lazy_ostream *)local_98,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_158,0x518);
    boost::detail::shared_count::~shared_count(&local_128.m_message.pn);
    if (0x1c < uStack_60._4_4_) {
      free((void *)local_78._0_8_);
      local_78._0_8_ = (char *)0x0;
    }
    local_168 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_160 = "";
    local_178 = &boost::unit_test::basic_cstring<char_const>::null;
    local_170 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x519;
    file_01.m_begin = (iterator)&local_168;
    msg_01.m_end = pvVar7;
    msg_01.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_178,
               msg_01);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_9c == SCRIPT_ERR_OK);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    ScriptErrorString_abi_cxx11_((string *)local_98,local_9c);
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_013aba30;
    local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
    local_188 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_180 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    uStack_60 = (char *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_188,0x519);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
    }
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    if (0x1c < uStack_3c) {
      free((void *)local_58._0_8_);
      local_58._0_8_ = (char *)0x0;
    }
    iVar2 = (int)local_200._vptr_BaseSignatureChecker;
    iVar5 = (int)local_200._vptr_BaseSignatureChecker + 1;
    local_200._vptr_BaseSignatureChecker._0_4_ = iVar5;
  } while (iVar2 < 66999);
  local_18c = (undefined1  [4])0x0;
  do {
    local_58[0] = 0x49;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_128,
               (ulong)(uint)local_18c,(value_type_conflict3 *)local_58,(allocator_type *)local_78);
    local_58._16_8_ = 0;
    stack0xffffffffffffffc0 = 0;
    local_58._0_8_ = (char *)0x0;
    local_58._8_8_ = 0;
    b._M_extent._M_extent_value =
         (long)local_128.m_message.px -
         (long)CONCAT71(local_128._1_7_,
                        local_128.p_predicate_value.super_readonly_property<bool>.
                        super_class_property<bool>.value);
    b._M_ptr = (pointer)CONCAT71(local_128._1_7_,
                                 local_128.p_predicate_value.super_readonly_property<bool>.
                                 super_class_property<bool>.value);
    CScript::operator<<((CScript *)local_58,b);
    local_1a0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_198 = "";
    local_1b0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x520;
    file_02.m_begin = (iterator)&local_1a0;
    msg_02.m_end = in_R9;
    msg_02.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_1b0,
               msg_02);
    rVar3.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)CScript::IsPushOnly((CScript *)local_58);
    local_148.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         rVar3.super_readonly_property<bool>.super_class_property<bool>.value;
    local_148.m_message.px = (element_type *)0x0;
    local_148.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_013aff98;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_c8 = (BaseSignatureChecker *)0xed17ef;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_013b0098;
    local_88._0_8_ = &local_e0;
    local_88._8_8_ = local_18c;
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_013b00d8;
    uStack_60 = " is not pure push.";
    local_1c0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_1b8 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    local_78._16_8_ = (string *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_148,(lazy_ostream *)local_78,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_1c0,0x520);
    boost::detail::shared_count::~shared_count(&local_148.m_message.pn);
    local_1d0 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_1c8 = "";
    local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
    local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x521;
    file_03.m_begin = (iterator)&local_1d0;
    msg_03.m_end = pvVar7;
    msg_03.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1e0,
               msg_03);
    local_78._16_8_ = 0;
    uStack_60 = (char *)0x0;
    local_78._0_8_ = (char *)0x0;
    local_78._8_8_ = 0;
    local_98[0] = 0x51;
    prevector<28U,_unsigned_char,_unsigned_int,_int>::insert
              ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)local_78,(iterator)local_78,
               (uchar *)local_98);
    local_200._vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_013afeb0;
    bVar4 = VerifyScript((CScript *)local_58,(CScript *)local_78,(CScriptWitness *)0x0,0x40,
                         &local_200,&local_9c);
    local_1f8.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar4;
    local_1f8.m_message.px = (element_type *)0x0;
    local_1f8.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_148.m_message.px = (element_type *)((ulong)local_148.m_message.px & 0xffffffffffffff00);
    local_148._0_8_ = &PTR__lazy_ostream_013aff98;
    local_148.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
    local_130 = "Length ";
    local_e0.m_message.px = (element_type *)((ulong)local_e0.m_message.px & 0xffffffffffffff00);
    local_e0._0_8_ = &PTR__lazy_ostream_013b0098;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)&local_148;
    local_c8 = (BaseSignatureChecker *)local_18c;
    local_98[8] = 0;
    local_98._0_8_ = &PTR__lazy_ostream_013b0118;
    local_88._0_8_ = &local_e0;
    local_88._8_8_ = " push is not minimal data.";
    local_210 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_208 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x1;
    boost::test_tools::tt_detail::report_assertion
              (&local_1f8,(lazy_ostream *)local_98,1,1,WARN,(check_type)in_stack_fffffffffffffdc0,
               (size_t)&local_210,0x521);
    boost::detail::shared_count::~shared_count(&local_1f8.m_message.pn);
    if (0x1c < uStack_60._4_4_) {
      free((void *)local_78._0_8_);
      local_78._0_8_ = (char *)0x0;
    }
    local_220 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_218 = "";
    local_230 = &boost::unit_test::basic_cstring<char_const>::null;
    local_228 = &boost::unit_test::basic_cstring<char_const>::null;
    file_04.m_end = (iterator)0x522;
    file_04.m_begin = (iterator)&local_220;
    msg_04.m_end = pvVar7;
    msg_04.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_230,
               msg_04);
    local_e0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)(local_9c == SCRIPT_ERR_OK);
    local_e0.m_message.px = (element_type *)0x0;
    local_e0.m_message.pn.pi_ = (sp_counted_base *)0x0;
    ScriptErrorString_abi_cxx11_((string *)local_98,local_9c);
    local_78._8_8_ = local_78._8_8_ & 0xffffffffffffff00;
    local_78._0_8_ = &PTR__lazy_ostream_013aba30;
    local_78._16_8_ = boost::unit_test::lazy_ostream::inst;
    in_stack_fffffffffffffdc0 =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/script_tests.cpp"
    ;
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x1;
    uStack_60 = (char *)local_98;
    boost::test_tools::tt_detail::report_assertion
              (&local_e0,(lazy_ostream *)local_78,1,1,WARN,0xecf2c0,(size_t)&stack0xfffffffffffffdc0
               ,0x522);
    if ((undefined1 *)local_98._0_8_ != local_98 + 0x10) {
      operator_delete((void *)local_98._0_8_,local_88._0_8_ + 1);
    }
    boost::detail::shared_count::~shared_count(&local_e0.m_message.pn);
    if (0x1c < uStack_3c) {
      free((void *)local_58._0_8_);
      local_58._0_8_ = (char *)0x0;
    }
    pvVar1 = (void *)CONCAT71(local_128._1_7_,
                              local_128.p_predicate_value.super_readonly_property<bool>.
                              super_class_property<bool>.value);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_128.m_message.pn.pi_ - (long)pvVar1);
    }
    local_18c = (undefined1  [4])((int)local_18c + 1);
  } while ((uint)local_18c < 0x209);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(script_standard_push)
{
    ScriptError err;
    for (int i=0; i<67000; i++) {
        CScript script;
        script << i;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Number " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Number " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }

    for (unsigned int i=0; i<=MAX_SCRIPT_ELEMENT_SIZE; i++) {
        std::vector<unsigned char> data(i, '\111');
        CScript script;
        script << data;
        BOOST_CHECK_MESSAGE(script.IsPushOnly(), "Length " << i << " is not pure push.");
        BOOST_CHECK_MESSAGE(VerifyScript(script, CScript() << OP_1, nullptr, SCRIPT_VERIFY_MINIMALDATA, BaseSignatureChecker(), &err), "Length " << i << " push is not minimal data.");
        BOOST_CHECK_MESSAGE(err == SCRIPT_ERR_OK, ScriptErrorString(err));
    }
}